

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall PcodeOp::PcodeOp(PcodeOp *this,int4 s,SeqNum *sq)

{
  size_type sVar1;
  reference ppVVar2;
  int local_38;
  int4 i;
  allocator<Varnode_*> local_21;
  SeqNum *local_20;
  SeqNum *sq_local;
  PcodeOp *pPStack_10;
  int4 s_local;
  PcodeOp *this_local;
  
  local_20 = sq;
  sq_local._4_4_ = s;
  pPStack_10 = this;
  SeqNum::SeqNum(&this->start,sq);
  std::_List_iterator<PcodeOp_*>::_List_iterator(&this->basiciter);
  std::_List_iterator<PcodeOp_*>::_List_iterator(&this->insertiter);
  std::_List_iterator<PcodeOp_*>::_List_iterator(&this->codeiter);
  sVar1 = (size_type)sq_local._4_4_;
  std::allocator<Varnode_*>::allocator(&local_21);
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector(&this->inrefs,sVar1,&local_21);
  std::allocator<Varnode_*>::~allocator(&local_21);
  this->flags = 0;
  this->addlflags = 0;
  this->parent = (BlockBasic *)0x0;
  this->output = (Varnode *)0x0;
  this->opcode = (TypeOp *)0x0;
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs);
    if (sVar1 <= (ulong)(long)local_38) break;
    ppVVar2 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                        (&this->inrefs,(long)local_38);
    *ppVVar2 = (value_type)0x0;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

PcodeOp::PcodeOp(int4 s,const SeqNum &sq) : start(sq),inrefs(s)

{
  flags = 0;			// Start out life as dead
  addlflags = 0;
  parent = (BlockBasic *)0; // No parent yet
  
  output = (Varnode *) 0;
  opcode = (TypeOp *)0;
  for(int4 i=0;i<inrefs.size();++i)
    inrefs[i] = (Varnode *)0;
}